

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleFunctionalTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest::iterate
          (MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  ContextInfo *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  float fVar8;
  MessageBuilder local_358;
  float local_1d8 [2];
  float result;
  float epsilon;
  void *data_ptr;
  int local_44;
  char *pcStack_40;
  GLint link_status;
  char *varying_name;
  int n_iteration;
  int local_24;
  long lStack_20;
  GLint compile_status;
  Functions *gl;
  MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest *pMStack_10;
  bool are_multisample_2d_array_tos_supported;
  MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest *this_local;
  
  pMStack_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  gl._7_1_ = glu::ContextInfo::isExtensionSupported
                       (this_00,"GL_OES_texture_storage_multisample_2d_array");
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_20 + 0x700))(1,&this->tfo_id);
  (**(code **)(lStack_20 + 0xd0))(0x8e22,this->tfo_id);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Could not set up a transform feedback object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xadc);
  (**(code **)(lStack_20 + 0x6c8))(1,&this->bo_id);
  (**(code **)(lStack_20 + 0x40))(0x8c8e,this->bo_id);
  (**(code **)(lStack_20 + 0x150))(0x8c8e,4,0,0x88e5);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Could not set up a buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xae3);
  if ((gl._7_1_ & 1) != 0) {
    (**(code **)(lStack_20 + 0x6f8))(1,&this->to_2d_multisample_array_id);
  }
  (**(code **)(lStack_20 + 0x6f8))(1,&this->to_2d_multisample_id);
  if ((gl._7_1_ & 1) != 0) {
    (**(code **)(lStack_20 + 0xb8))(0x9102,this->to_2d_multisample_array_id);
  }
  (**(code **)(lStack_20 + 0xb8))(0x9100,this->to_2d_multisample_id);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Could not set up texture objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xaf8);
  (**(code **)(lStack_20 + 0x1390))(0x9100,2,0x8058,0x10,0x20,1);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,
                  "glTexStorage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xaff);
  if ((gl._7_1_ & 1) != 0) {
    (**(code **)(lStack_20 + 0x13a8))(0x9102,2,0x8058,0x10,0x20,8,1);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,
                    "gltexStorage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                    ,0xb0a);
  }
  local_24 = 0;
  GVar3 = (**(code **)(lStack_20 + 0x3f0))(0x8b30);
  this->fs_id = GVar3;
  (**(code **)(lStack_20 + 0x12b8))(this->fs_id,1,&iterate::fs_body,0);
  (**(code **)(lStack_20 + 0x248))(this->fs_id);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Could not set up a fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xb19);
  (**(code **)(lStack_20 + 0xa70))(this->fs_id,0x8b81,&local_24);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Could not query fragment shader\'s compile status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xb1c);
  if (local_24 == 0) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Could not compile fragment shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0xb20);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar3 = (**(code **)(lStack_20 + 0x3f0))(0x8b31);
  this->vs_2d_id = GVar3;
  (**(code **)(lStack_20 + 0x12b8))(this->vs_2d_id,1,&iterate::vs_2d_body,0);
  (**(code **)(lStack_20 + 0x248))(this->vs_2d_id);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Could not set up a vertex shader for 2D multisample texture case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xb3d);
  (**(code **)(lStack_20 + 0xa70))(this->vs_2d_id,0x8b81,&local_24);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Could not query 2D multisample texture vertex shader\'s compile status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                  ,0xb40);
  if (local_24 == 0) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Could not compile vertex shader for 2D multisample texture",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
               ,0xb44);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if ((gl._7_1_ & 1) != 0) {
    GVar3 = (**(code **)(lStack_20 + 0x3f0))(0x8b31);
    this->vs_2d_array_id = GVar3;
    (**(code **)(lStack_20 + 0x12b8))(this->vs_2d_array_id,1,&iterate::vs_2d_array_body,0);
    (**(code **)(lStack_20 + 0x248))(this->vs_2d_array_id);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"Could not set up a vertex shader for 2D multisample array texture case",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                    ,0xb64);
    (**(code **)(lStack_20 + 0xa70))(this->vs_2d_array_id,0x8b81,&local_24);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,
                    "Could not query 2D multisample array texture vertex shader\'s compile status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                    ,0xb68);
    if (local_24 == 0) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Could not compile vertex shader for 2D multisample array texture",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                 ,0xb6c);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  varying_name._0_4_ = 0;
  do {
    if (1 < (int)varying_name) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    if (((int)varying_name != 1) || ((gl._7_1_ & 1) != 0)) {
      if (this->po_id != 0) {
        (**(code **)(lStack_20 + 0x448))(this->po_id);
        this->po_id = 0;
      }
      GVar3 = (**(code **)(lStack_20 + 0x3c8))();
      this->po_id = GVar3;
      if ((int)varying_name == 0) {
        (**(code **)(lStack_20 + 0x10))(this->po_id,this->fs_id);
        (**(code **)(lStack_20 + 0x10))(this->po_id,this->vs_2d_id);
      }
      else {
        if ((int)varying_name != 1) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Unrecognized iteration index",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                     ,0xb9d);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (**(code **)(lStack_20 + 0x10))(this->po_id,this->fs_id);
        (**(code **)(lStack_20 + 0x10))(this->po_id,this->vs_2d_array_id);
      }
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glAttachShader() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xba0);
      pcStack_40 = "is_size_correct";
      (**(code **)(lStack_20 + 0x14c8))(this->po_id,1,&stack0xffffffffffffffc0,0x8c8c);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glTransformFeedbackVaryings() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xba6);
      local_44 = 0;
      (**(code **)(lStack_20 + 0xce8))(this->po_id);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xbac);
      (**(code **)(lStack_20 + 0x9d8))(this->po_id,0x8b82,&local_44);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xbaf);
      if (local_44 != 1) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&data_ptr,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&data_ptr,
                            (char (*) [48])"Linking failed for program object in iteration ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&varying_name);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&data_ptr);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Program object linking failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                   ,0xbb6);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lStack_20 + 0x48))(0x8c8e,0,this->bo_id);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glBindBufferBase() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xbbb);
      (**(code **)(lStack_20 + 0x1680))(this->po_id);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glUseProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xbbe);
      (**(code **)(lStack_20 + 0x30))(0);
      (**(code **)(lStack_20 + 0x538))(0,0,1);
      (**(code **)(lStack_20 + 0x638))();
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"Rendering failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xbc6);
      _result = (float *)0x0;
      local_1d8[1] = 1e-05;
      local_1d8[0] = 0.0;
      _result = (float *)(**(code **)(lStack_20 + 0xd00))(0x8c8e,0,4,3);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glMapBufferRange() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xbd1);
      local_1d8[0] = *_result;
      memset(_result,0,4);
      (**(code **)(lStack_20 + 0x1670))(0x8c8e);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glUnmapBuffer() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                      ,0xbd7);
      fVar8 = de::abs<float>(local_1d8[0] - 1.0);
      if (1e-05 < fVar8) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_358,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [18])"Retrieved value: ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1d8);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])", expected: 1.0");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_358);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid value reported.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleFunctionalTests.cpp"
                   ,0xbde);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    varying_name._0_4_ = (int)varying_name + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest::iterate()
{
	bool are_multisample_2d_array_tos_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up a TFO */
	gl.genTransformFeedbacks(1, &tfo_id);
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, tfo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a transform feedback object");

	/* Set up a buffer object */
	gl.genBuffers(1, &bo_id);
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, bo_id);
	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(float), NULL, GL_STATIC_READ);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a buffer object");

	/* Set up texture objects */
	if (are_multisample_2d_array_tos_supported)
	{
		gl.genTextures(1, &to_2d_multisample_array_id);
	}

	gl.genTextures(1, &to_2d_multisample_id);

	/* NOTE: Since we're binding the textures to zero texture unit,
	 *       we don't need to do glUniform1i() calls to configure
	 *       the texture samplers in the vertex shaders later on.
	 */
	if (are_multisample_2d_array_tos_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_2d_multisample_array_id);
	}

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_2d_multisample_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture objects");

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, /* samples */
							   GL_RGBA8, 16,				 /* width */
							   32,							 /* height */
							   GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glTexStorage2DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE texture target");

	if (are_multisample_2d_array_tos_supported)
	{
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 2, /* samples */
								   GL_RGBA8, 16,						   /* width */
								   32,									   /* height */
								   8,									   /* depth */
								   GL_TRUE);							   /* fixedsamplelocations */
		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"gltexStorage3DMultisample() call failed for GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target");
	}

	/* Set up a fragment shader */
	glw::GLint		   compile_status = GL_FALSE;
	static const char* fs_body		  = "#version 310 es\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	fs_id = gl.createShader(GL_FRAGMENT_SHADER);

	gl.shaderSource(fs_id, 1 /* count */, &fs_body, NULL);
	gl.compileShader(fs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a fragment shader");

	gl.getShaderiv(fs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query fragment shader's compile status");

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("Could not compile fragment shader");
	}

	/* Set up a vertex shader for 2D multisample texture case */
	static const char* vs_2d_body = "#version 310 es\n"
									"\n"
									"precision highp float;\n"
									"\n"
									"uniform highp sampler2DMS sampler;\n"
									"out           float       is_size_correct;\n"
									"\n"
									"void main()\n"
									"{\n"
									"    ivec2 size = textureSize(sampler);\n"
									"\n"
									"    if (size.x == 16 && size.y == 32)\n"
									"    {\n"
									"        is_size_correct = 1.0f;\n"
									"    }\n"
									"    else\n"
									"    {\n"
									"        is_size_correct = 0.0f;\n"
									"    }\n"
									"}\n";

	vs_2d_id = gl.createShader(GL_VERTEX_SHADER);

	gl.shaderSource(vs_2d_id, 1 /* count */, &vs_2d_body, NULL);
	gl.compileShader(vs_2d_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a vertex shader for 2D multisample texture case");

	gl.getShaderiv(vs_2d_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query 2D multisample texture vertex shader's compile status");

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("Could not compile vertex shader for 2D multisample texture");
	}

	/* Set up a vertex shader for 2D multisample array texture case */
	if (are_multisample_2d_array_tos_supported)
	{
		static const char* vs_2d_array_body = "#version 310 es\n"
											  "\n"
											  "#extension GL_OES_texture_storage_multisample_2d_array : enable\n"
											  "precision highp float;\n"
											  "\n"
											  "uniform highp sampler2DMSArray sampler;\n"
											  "out           float            is_size_correct;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    ivec3 size = textureSize(sampler);\n"
											  "\n"
											  "    if (size.x == 16 && size.y == 32 && size.z == 8)\n"
											  "    {\n"
											  "        is_size_correct = 1.0f;\n"
											  "    }\n"
											  "    else\n"
											  "    {\n"
											  "        is_size_correct = 0.0f;\n"
											  "    }\n"
											  "}\n";

		vs_2d_array_id = gl.createShader(GL_VERTEX_SHADER);

		gl.shaderSource(vs_2d_array_id, 1 /* count */, &vs_2d_array_body, NULL);
		gl.compileShader(vs_2d_array_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a vertex shader for 2D multisample array texture case");

		gl.getShaderiv(vs_2d_array_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(),
							"Could not query 2D multisample array texture vertex shader's compile status");

		if (compile_status == GL_FALSE)
		{
			TCU_FAIL("Could not compile vertex shader for 2D multisample array texture");
		}
	}

	/* Execute two iterations:
	 *
	 * a) Create a program object using fs and vs_2d shaders;
	 * b) Create a program object using fs and vs_2d_array shaders.
	 *
	 * Case b) should only be executed if 2D Array MS textures are
	 * supported.
	 */
	for (int n_iteration = 0; n_iteration < 2 /* iterations */; ++n_iteration)
	{
		if (n_iteration == 1 && !are_multisample_2d_array_tos_supported)
		{
			/* Skip the iteration */
			continue;
		}

		if (po_id != 0)
		{
			gl.deleteProgram(po_id);

			po_id = 0;
		}

		po_id = gl.createProgram();

		/* Attach iteration-specific shaders */
		switch (n_iteration)
		{
		case 0:
		{
			gl.attachShader(po_id, fs_id);
			gl.attachShader(po_id, vs_2d_id);

			break;
		}

		case 1:
		{
			gl.attachShader(po_id, fs_id);
			gl.attachShader(po_id, vs_2d_array_id);

			break;
		}

		default:
			TCU_FAIL("Unrecognized iteration index");
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

		/* Configure the program object for XFB */
		const char* varying_name = "is_size_correct";

		gl.transformFeedbackVaryings(po_id, 1 /* count */, &varying_name, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

		/* Link the program object */
		glw::GLint link_status = GL_FALSE;

		gl.linkProgram(po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status != GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Linking failed for program object in iteration "
							   << n_iteration << tcu::TestLog::EndMessage;

			TCU_FAIL("Program object linking failed");
		}

		/* Render a point using the program */
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

		gl.useProgram(po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		gl.beginTransformFeedback(GL_POINTS);
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		}
		gl.endTransformFeedback();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		/* Read the captured data. Reset the contents of the BO before the buffer
		 * object is unmapped.
		 */
		void*		data_ptr = NULL;
		const float epsilon  = (float)1e-5;
		float		result   = 0.0f;

		data_ptr = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, sizeof(float) /* size */,
									 GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed");

		result = *((const float*)data_ptr);
		memset(data_ptr, 0, sizeof(float));

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");

		if (de::abs(result - 1.0f) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Retrieved value: " << result << ", expected: 1.0"
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported.");
		}
	}

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}